

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TransRangeSyntax::setChild(TransRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  TransRepeatRangeSyntax *local_118;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  size_t local_18;
  size_t index_local;
  TransRangeSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                       (pSVar2);
    SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator=(&this->items,pSVar1);
  }
  else {
    if (index != 1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_b9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_f0,0x326d);
      std::operator+(&local_78,&local_98,&local_f0);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_118 = (TransRepeatRangeSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_118 = SyntaxNode::as<slang::syntax::TransRepeatRangeSyntax>(pSVar2);
    }
    this->repeat = local_118;
  }
  return;
}

Assistant:

void TransRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: repeat = child.node() ? &child.node()->as<TransRepeatRangeSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}